

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_workgraph.cpp
# Opt level: O2

uint32_t dxil_spv::get_node_stride_from_annotate_handle(CallInst *inst)

{
  bool bVar1;
  uint32_t uVar2;
  Value *pVVar3;
  CallInst *this;
  ConstantAggregate *this_00;
  Constant *pCVar4;
  APInt *pAVar5;
  uint64_t uVar6;
  uint64_t uVar7;
  
  pVVar3 = LLVMBC::Instruction::getOperand(&inst->super_Instruction,1);
  bVar1 = value_is_dx_op_instrinsic(pVVar3,IndexNodeHandle);
  if (bVar1) {
    pVVar3 = LLVMBC::Instruction::getOperand(&inst->super_Instruction,1);
    this = LLVMBC::cast<LLVMBC::CallInst>(pVVar3);
    pVVar3 = LLVMBC::Instruction::getOperand(&this->super_Instruction,1);
    inst = LLVMBC::cast<LLVMBC::CallInst>(pVVar3);
  }
  pVVar3 = LLVMBC::Instruction::getOperand(&inst->super_Instruction,2);
  this_00 = LLVMBC::cast<LLVMBC::ConstantAggregate>(pVVar3);
  pCVar4 = LLVMBC::ConstantAggregate::getOperand(this_00,0);
  pCVar4 = &LLVMBC::cast<LLVMBC::ConstantInt>(&pCVar4->super_Value)->super_Constant;
  pAVar5 = LLVMBC::Constant::getUniqueInteger(pCVar4);
  uVar6 = LLVMBC::APInt::getZExtValue(pAVar5);
  pCVar4 = LLVMBC::ConstantAggregate::getOperand(this_00,1);
  pCVar4 = &LLVMBC::cast<LLVMBC::ConstantInt>(&pCVar4->super_Value)->super_Constant;
  pAVar5 = LLVMBC::Constant::getUniqueInteger(pCVar4);
  uVar7 = LLVMBC::APInt::getZExtValue(pAVar5);
  uVar2 = (uint32_t)uVar7;
  if (((uint)uVar6 >> 8 & 1) != 0) {
    uVar2 = ((uint32_t)uVar7 + 3 & 0xfffffffc) + 4;
  }
  return uVar2;
}

Assistant:

static uint32_t get_node_stride_from_annotate_handle(const llvm::CallInst *inst)
{
	// This is a red herring, since the flags are wrong. Gotta keep digging ... >_<
	if (value_is_dx_op_instrinsic(inst->getOperand(1), DXIL::Op::IndexNodeHandle))
	{
		auto *index_handle = llvm::cast<llvm::CallInst>(inst->getOperand(1));
		inst = llvm::cast<llvm::CallInst>(index_handle->getOperand(1));
	}

	auto *type_operand = llvm::cast<llvm::ConstantAggregate>(inst->getOperand(2));
	uint32_t node_io_flags = llvm::cast<llvm::ConstantInt>(type_operand->getOperand(0))->getUniqueInteger().getZExtValue();
	uint32_t stride = llvm::cast<llvm::ConstantInt>(type_operand->getOperand(1))->getUniqueInteger().getZExtValue();

	if ((node_io_flags & DXIL::NodeIOTrackRWInputSharingBit) != 0)
	{
		stride = (stride + 3u) & ~3u;
		stride += 4;
	}

	return stride;
}